

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * ODDLParser::OpenDDLParser::parseIdentifier(char *in,char *end,Text **id)

{
  long lVar1;
  ulong uVar2;
  Text *this;
  byte *pbVar3;
  uint uVar4;
  byte *pbVar5;
  size_t sVar6;
  size_t sVar7;
  
  *id = (Text *)0x0;
  if (in != end && in != (char *)0x0) {
    do {
      uVar2 = (ulong)(byte)*in;
      if ((0x2c < uVar2) || ((0x100100002600U >> (uVar2 & 0x3f) & 1) == 0)) goto LAB_006e81d1;
      in = (char *)((byte *)in + 1);
    } while (in != end);
    uVar2 = (ulong)(byte)*end;
    in = end;
LAB_006e81d1:
    if (9 < (byte)((char)uVar2 - 0x30U)) {
      sVar6 = 0;
      pbVar3 = (byte *)in;
      while (((((pbVar5 = pbVar3, sVar7 = sVar6, 0x2c < (byte)uVar2 ||
                ((0x130100000200U >> (uVar2 & 0x3f) & 1) == 0)) &&
               ((uVar4 = (int)uVar2 - 0x5b, 0x22 < uVar4 ||
                ((0x500000001U >> ((ulong)uVar4 & 0x3f) & 1) == 0)))) &&
              (pbVar5 = (byte *)end, sVar7 = (long)end - (long)in, (byte *)in + sVar6 != (byte *)end
              )) && ((0x24 < (byte)uVar2 ||
                     (pbVar5 = (byte *)in + sVar6, sVar7 = sVar6,
                     (0x1000002400U >> (uVar2 & 0x3f) & 1) == 0))))) {
        pbVar3 = pbVar3 + 1;
        lVar1 = sVar6 + 1;
        sVar6 = sVar6 + 1;
        uVar2 = (ulong)((byte *)in)[lVar1];
      }
      this = (Text *)operator_new(0x18);
      Text::Text(this,in,sVar7);
      *id = this;
      in = (char *)pbVar5;
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseIdentifier( char *in, char *end, Text **id ) {
    *id = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    // ignore blanks
    in = lookForNextToken( in, end );

    // staring with a number is forbidden
    if( isNumeric<const char>( *in ) ) {
        return in;
    }

    // get size of id
    size_t idLen( 0 );
    char *start( in );
    while( !isSeparator( *in ) && 
            !isNewLine( *in ) && ( in != end ) && 
            *in != Grammar::OpenPropertyToken[ 0 ] &&
            *in != Grammar::ClosePropertyToken[ 0 ] && 
            *in != '$' ) {
        ++in;
        ++idLen;
    }

    const size_t len( idLen );
    *id = new Text( start, len );

    return in;
}